

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAdapter::makeZhouRose
          (EAMAdapter *this,RealType re,RealType fe,RealType rhoe,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda,RealType F0)

{
  bool bVar1;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  ZhouParameters zhouParam;
  EAMParameters eamParam;
  string *in_stack_fffffffffffffde8;
  AtomType *in_stack_fffffffffffffdf0;
  ZhouParameters *pZVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffe68;
  AtomType *in_stack_fffffffffffffe70;
  string local_70 [32];
  undefined8 local_50;
  undefined8 local_10;
  
  local_10 = CONCAT44(in_XMM0_Db,in_XMM0_Da);
  bVar1 = isEAM((EAMAdapter *)0x29d42d);
  if (bVar1) {
    AtomType::removeProperty(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    AtomType::removeProperty(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  std::__cxx11::string::string(local_70);
  local_50 = 0;
  pZVar2 = (ZhouParameters *)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x29d514);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x29d53a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x29d5cc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x29d5f2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x29d618);
  local_50 = local_10;
  __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDI;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (__args,(EAMParameters *)pZVar2);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffdf0,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)in_stack_fffffffffffffde8
            );
  AtomType::addProperty(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x29d752);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x29d75c);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (__args,pZVar2);
  pZVar2 = (ZhouParameters *)&stack0xfffffffffffffe38;
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)pZVar2,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)
             in_stack_fffffffffffffde8);
  AtomType::addProperty(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x29d7b3);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)0x29d7bd);
  ZhouParameters::~ZhouParameters(pZVar2);
  EAMParameters::~EAMParameters((EAMParameters *)0x29d7d7);
  return;
}

Assistant:

void EAMAdapter::makeZhouRose(RealType re, RealType fe, RealType rhoe,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                RealType F0) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType         = eamZhouRose;
    eamParam.latticeConstant = re;
    zhouParam.re             = re;
    zhouParam.fe             = fe;
    zhouParam.rhoe           = rhoe;
    zhouParam.alpha          = alpha;
    zhouParam.beta           = beta;
    zhouParam.A              = A;
    zhouParam.B              = B;
    zhouParam.kappa          = kappa;
    zhouParam.lambda         = lambda;
    zhouParam.F0             = F0;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }